

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O3

void __thiscall EchoServer::EchoServer(EchoServer *this,EventLoop *loop,char *ip,uint16_t port)

{
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  TcpServer::TcpServer(&this->es_server,loop,ip,port);
  this->es_loop = loop;
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(const_std::shared_ptr<TcpConnection>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tests/echo_server.cpp:12:36)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(const_std::shared_ptr<TcpConnection>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tests/echo_server.cpp:12:36)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  std::function<void_(const_std::shared_ptr<TcpConnection>_&)>::operator=
            (&(this->es_server).ts_connected_cb,
             (function<void_(const_std::shared_ptr<TcpConnection>_&)> *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(const_std::shared_ptr<TcpConnection>_&,_InputBuffer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tests/echo_server.cpp:13:34)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(const_std::shared_ptr<TcpConnection>_&,_InputBuffer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tests/echo_server.cpp:13:34)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  std::function<void_(const_std::shared_ptr<TcpConnection>_&,_InputBuffer_*)>::operator=
            (&(this->es_server).ts_msg_cb,
             (function<void_(const_std::shared_ptr<TcpConnection>_&,_InputBuffer_*)> *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tests/echo_server.cpp:14:32)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tests/echo_server.cpp:14:32)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  std::function<void_()>::operator=(&(this->es_server).ts_close_cb,(function<void_()> *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return;
}

Assistant:

EchoServer(EventLoop* loop, const char *ip, uint16_t port) :
            es_loop(loop), es_server(loop, ip, port) 
    {
        es_server.set_connected_cb([this](const TcpConnSP& conn){ this->echo_conneted_cb(conn); });
        es_server.set_message_cb([this](const TcpConnSP& conn, InputBuffer* ibuf){ this->echo_message_cb(conn, ibuf); });
        es_server.set_close_cb([this](){ this->echo_close_cb(); });
    }